

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.hpp
# Opt level: O0

void __thiscall Diligent::GLContextState::BoundImageInfo::BoundImageInfo(BoundImageInfo *this)

{
  BoundImageInfo *this_local;
  
  this->InterfaceID = -1;
  this->GLHandle = 0;
  this->MipLevel = 0;
  this->IsLayered = '\0';
  this->Layer = 0;
  this->Access = 0;
  this->Format = 0;
  return;
}

Assistant:

BoundImageInfo(){}